

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::correct_momentum_error
               (Mesh *mesh,TransferOpts *xfer_opts,Graph *diffusion_graph,TagBase *tagbase,
               bool verbose)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  CommPtr *pCVar2;
  LOs *pLVar3;
  _Base_ptr p_Var4;
  int *piVar5;
  void **ppvVar6;
  Alloc *pAVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  pointer pcVar12;
  VarCompareOpts opts;
  element_type *peVar13;
  undefined8 uVar14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  element_type *peVar17;
  element_type *peVar18;
  uint uVar19;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Alloc_hider _Var22;
  bool bVar23;
  LO size_in;
  int iVar24;
  string *psVar25;
  const_iterator cVar26;
  undefined8 *puVar27;
  const_iterator cVar28;
  Alloc *pAVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  Mesh *this;
  Reals elem_masses;
  Read<double> elem_errors;
  IntIterator last;
  Read<double> vert_masses;
  Reals new_velocities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  Write<double> out;
  Read<double> vert_velocities;
  Reals elem_sizes;
  Read<signed_char> all_flags;
  Reals new_elem_momenta;
  Reals elem_velocities;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> density_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> momentum_name;
  string velocity_name;
  type f;
  Read<double> old_elem_densities;
  Read<double> elem_densities;
  Adj verts2elems;
  Read<double> elem_errors_from_density;
  Reals old_elem_momenta;
  Reals old_elem_masses;
  Vector<3> v;
  Adj elems2verts;
  VarCompareOpts diffuse_tol;
  Read<signed_char> local_670;
  Mesh *local_660;
  string *local_658;
  Alloc *local_650;
  element_type *local_648;
  uint local_640;
  LO local_63c;
  element_type *local_638;
  element_type *local_630;
  undefined1 local_628 [32];
  Alloc *local_608;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_600;
  Library *local_5f8;
  element_type *local_5f0;
  Alloc *local_5e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_5e0;
  int local_5d8;
  element_type *local_5d0;
  element_type *local_5c8;
  element_type *local_5c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5b8;
  element_type *local_5b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5a8;
  uint local_5a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_598;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_588;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  string local_578;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_558;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_528;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_520;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_518;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_508;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  Read<signed_char> local_4e8;
  Reals local_4d8;
  Read<double> local_4c8;
  Read<double> local_4b8;
  undefined1 local_4a8 [32];
  Read<double> local_488;
  element_type local_478;
  element_type local_448;
  Read<double> local_418;
  Read<double> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3f0;
  element_type local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_350;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_348;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  key_type local_308;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  Alloc *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  int local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_290;
  element_type *local_288;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_280;
  element_type *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  element_type *local_268;
  uint local_260;
  element_type *local_258;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_250;
  Alloc *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  Read<double> local_238;
  Alloc *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_220;
  Write<double> local_218;
  Read<double> local_208;
  string local_1f8;
  element_type *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  Read<double> local_1c8;
  Read<double> local_1b8;
  Graph local_1a8;
  Read<double> local_188;
  Read<double> local_178;
  Alloc *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  Adj local_148;
  undefined1 local_118 [16];
  Write<double> local_108;
  Write<double> local_f8;
  undefined1 local_e8 [16];
  Reals local_d8;
  Write<double> local_c8;
  undefined1 local_b8 [16];
  Write<double> local_a8;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  element_type *local_88;
  Adj local_78;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  element_type *local_38;
  
  local_658 = (string *)(ulong)(uint)mesh->dim_;
  local_660 = mesh;
  if ((uint)mesh->dim_ < 4) {
    local_640 = TagBase::ncomps(tagbase);
    psVar25 = TagBase::name_abi_cxx11_(tagbase);
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    pcVar12 = (psVar25->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,pcVar12,pcVar12 + psVar25->_M_string_length);
    cVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(xfer_opts->velocity_momentum_map)._M_t,&local_308);
    local_328._0_8_ = &local_318;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_328,*(long *)(cVar26._M_node + 2),
               (long)&(cVar26._M_node[2]._M_parent)->_M_color + *(long *)(cVar26._M_node + 2));
    cVar26 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&(xfer_opts->velocity_density_map)._M_t,&local_308);
    local_348._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_348,*(long *)(cVar26._M_node + 2),
               (long)&(cVar26._M_node[2]._M_parent)->_M_color + *(long *)(cVar26._M_node + 2));
    local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_578,local_328._0_8_,(char *)(local_328._0_8_ + local_328._8_8_));
    std::__cxx11::string::append((char *)&local_578);
    Mesh::get_array<double>((Mesh *)&local_158,(Int)local_660,local_658);
    Mesh::ask_sizes((Mesh *)&local_538);
    local_408.write_.shared_alloc_.alloc = (Alloc *)local_158._M_pi;
    if (((ulong)local_158._M_pi & 7) == 0 && (Alloc *)local_158._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_408.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_158._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_158._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_158._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_408.write_.shared_alloc_.direct_ptr = local_150._M_pi;
    local_418.write_.shared_alloc_.alloc = (Alloc *)local_538._M_pi;
    if (((ulong)local_538._M_pi & 7) == 0 && (Alloc *)local_538._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_418.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_538._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_538._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_538._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_418.write_.shared_alloc_.direct_ptr = local_530._M_pi;
    pAVar7 = (Alloc *)(local_628 + 0x10);
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    multiply_each<double>((Omega_h *)&local_a8,&local_408,&local_418,(string *)local_628);
    Read<double>::Read(&local_670,&local_a8);
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(local_a8.shared_alloc_.alloc,0x48);
      }
    }
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    pAVar29 = local_418.write_.shared_alloc_.alloc;
    if (((ulong)local_418.write_.shared_alloc_.alloc & 7) == 0 &&
        local_418.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_418.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_418.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_408.write_.shared_alloc_.alloc;
    if (((ulong)local_408.write_.shared_alloc_.alloc & 7) == 0 &&
        local_408.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_408.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_408.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    Mesh::get_array<double>((Mesh *)&local_548,(Int)local_660,(string *)0x0);
    local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_3e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"old_","");
    puVar27 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_3f8,(ulong)local_348._M_pi);
    pAVar29 = (Alloc *)(puVar27 + 2);
    if ((Alloc *)*puVar27 == pAVar29) {
      local_628._16_8_ = pAVar29->size;
      local_628._24_8_ = puVar27[3];
      local_628._0_8_ = pAVar7;
    }
    else {
      local_628._16_8_ = pAVar29->size;
      local_628._0_8_ = (Alloc *)*puVar27;
    }
    local_628._8_8_ = puVar27[1];
    *puVar27 = pAVar29;
    puVar27[1] = 0;
    *(undefined1 *)(puVar27 + 2) = 0;
    Mesh::get_array<double>((Mesh *)&local_168,(Int)local_660,local_658);
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    if ((element_type *)local_3f8._M_pi != &local_3e8) {
      operator_delete(local_3f8._M_pi,
                      (ulong)((long)&(((Graph *)
                                      &(local_3e8.parent_comm_.
                                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->library_)->a2ab).write_.shared_alloc_.alloc + 1));
    }
    local_448.codes.write_.shared_alloc_.alloc = local_168;
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_448.codes.write_.shared_alloc_.alloc = (Alloc *)(local_168->size * 8 + 1);
      }
      else {
        local_168->use_count = local_168->use_count + 1;
      }
    }
    local_448.codes.write_.shared_alloc_.direct_ptr = local_160._M_pi;
    local_448.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_538._M_pi;
    if (((ulong)local_538._M_pi & 7) == 0 && (Alloc *)local_538._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_448.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_538._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_538._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_538._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_448.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = local_530._M_pi;
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    multiply_each<double>
              ((Omega_h *)&local_c8,(Read<double> *)&local_448.codes,
               (Read<double> *)&local_448.super_Graph.ab2b,(string *)local_628);
    Read<double>::Read((Read<signed_char> *)local_b8,&local_c8);
    if (((ulong)local_c8.shared_alloc_.alloc & 7) == 0 &&
        local_c8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_c8.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_c8.shared_alloc_.alloc);
        operator_delete(local_c8.shared_alloc_.alloc,0x48);
      }
    }
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    pAVar29 = local_448.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_448.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_448.super_Graph.ab2b.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_448.super_Graph.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_448.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_448.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_448.codes.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_448.codes.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    local_d8.write_.shared_alloc_.alloc = (Alloc *)local_548._M_pi;
    if (((ulong)local_548._M_pi & 7) == 0 && (Alloc *)local_548._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d8.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_548._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_548._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_548._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_d8.write_.shared_alloc_.direct_ptr = local_540._M_pi;
    local_510._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_448;
    local_508._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8;
    average_field((Omega_h *)local_510._M_pi,local_660,(Int)local_658,local_640,
                  (Reals *)(local_e8 + 0x10));
    pAVar29 = local_d8.write_.shared_alloc_.alloc;
    if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    local_478.codes.write_.shared_alloc_.alloc =
         local_448.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_448.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_478.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_478.codes.write_.shared_alloc_.direct_ptr =
         local_448.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_478.super_Graph.ab2b.write_.shared_alloc_.alloc = (Alloc *)local_b8._0_8_;
    if ((local_b8._0_8_ & 7) == 0 && (Alloc *)local_b8._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_478.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)(*(size_t *)local_b8._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_b8._0_8_ + 0x30) = *(int *)(local_b8._0_8_ + 0x30) + 1;
      }
    }
    local_478.super_Graph.ab2b.write_.shared_alloc_.direct_ptr = (void *)local_b8._8_8_;
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    multiply_each<double>
              ((Omega_h *)&local_f8,(Read<double> *)&local_478.codes,
               (Read<double> *)&local_478.super_Graph.ab2b,(string *)local_628);
    local_518._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8;
    Read<double>::Read((Read<signed_char> *)local_518._M_pi,&local_f8);
    if (((ulong)local_f8.shared_alloc_.alloc & 7) == 0 &&
        local_f8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_f8.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_f8.shared_alloc_.alloc);
        operator_delete(local_f8.shared_alloc_.alloc,0x48);
      }
    }
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    pAVar29 = local_478.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_478.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_478.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_478.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_478.super_Graph.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_478.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_478.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_478.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_478.codes.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_478.codes.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    local_488.write_.shared_alloc_.alloc = local_448.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_448.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_488.write_.shared_alloc_.alloc =
             (Alloc *)((local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_488.write_.shared_alloc_.direct_ptr =
         local_448.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_4a8._16_8_ = local_670.write_.shared_alloc_.alloc;
    if (((ulong)local_670.write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_670.write_.shared_alloc_.alloc != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_4a8._16_8_ =
             (long)(((CommPtr *)&(local_670.write_.shared_alloc_.alloc)->size)->
                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr * 8 + 1;
      }
      else {
        *(int *)&(((LOs *)&(local_670.write_.shared_alloc_.alloc)->use_count)->write_).shared_alloc_
                 .alloc =
             *(int *)&(((LOs *)&(local_670.write_.shared_alloc_.alloc)->use_count)->write_).
                      shared_alloc_.alloc + 1;
      }
    }
    local_4a8._24_8_ = local_670.write_.shared_alloc_.direct_ptr;
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    multiply_each<double>
              ((Omega_h *)&local_108,&local_488,(Read<double> *)(local_4a8 + 0x10),
               (string *)local_628);
    local_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_478;
    Read<double>::Read((Read<signed_char> *)local_520._M_pi,&local_108);
    if (((ulong)local_108.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_108.shared_alloc_.alloc != (Library *)0x0) {
      pCVar2 = (CommPtr *)&(local_108.shared_alloc_.alloc)->use_count;
      *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
           -1;
      if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          0) {
        Alloc::~Alloc(local_108.shared_alloc_.alloc);
        operator_delete(local_108.shared_alloc_.alloc,0x48);
      }
    }
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,local_628._16_8_ + 1);
    }
    uVar14 = local_4a8._16_8_;
    if ((local_4a8._16_8_ & 7) == 0 && (Alloc *)local_4a8._16_8_ != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_4a8._16_8_ + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_4a8._16_8_);
        operator_delete((void *)uVar14,0x48);
      }
    }
    pAVar29 = local_488.write_.shared_alloc_.alloc;
    if (((ulong)local_488.write_.shared_alloc_.alloc & 7) == 0 &&
        local_488.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_488.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_488.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    local_178.write_.shared_alloc_.alloc = local_478.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_478.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_478.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_178.write_.shared_alloc_.alloc =
             (Alloc *)((local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_178.write_.shared_alloc_.direct_ptr =
         local_478.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_188.write_.shared_alloc_.alloc = (Alloc *)local_e8._0_8_;
    if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_188.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_e8._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_e8._0_8_ + 0x30) = *(int *)(local_e8._0_8_ + 0x30) + 1;
      }
    }
    local_188.write_.shared_alloc_.direct_ptr = (void *)local_e8._8_8_;
    local_528._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118;
    subtract_each<double>((Omega_h *)local_528._M_pi,&local_178,&local_188);
    pAVar29 = local_188.write_.shared_alloc_.alloc;
    if (((ulong)local_188.write_.shared_alloc_.alloc & 7) == 0 &&
        local_188.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_188.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_188.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_178.write_.shared_alloc_.alloc;
    if (((ulong)local_178.write_.shared_alloc_.alloc & 7) == 0 &&
        local_178.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_178.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_178.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    Mesh::ask_up(&local_148,local_660,0,(Int)local_658);
    local_1a8.a2ab.write_.shared_alloc_.alloc =
         local_148.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1a8.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_148.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_1a8.a2ab.write_.shared_alloc_.direct_ptr =
         local_148.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_1a8.ab2b.write_.shared_alloc_.alloc =
         local_148.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc != (Library *)0x0) {
      if (entering_parallel == '\x01') {
        local_1a8.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)(*(long *)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((CommPtr *)&(local_148.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count)->
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((CommPtr *)
                       &(local_148.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count)->
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_1a8.ab2b.write_.shared_alloc_.direct_ptr =
         local_148.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_1b8.write_.shared_alloc_.alloc = local_670.write_.shared_alloc_.alloc;
    if (((ulong)local_670.write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_670.write_.shared_alloc_.alloc != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1b8.write_.shared_alloc_.alloc =
             (Alloc *)((long)(((CommPtr *)&(local_670.write_.shared_alloc_.alloc)->size)->
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr *
                       8 + 1);
      }
      else {
        *(int *)&(((LOs *)&(local_670.write_.shared_alloc_.alloc)->use_count)->write_).shared_alloc_
                 .alloc =
             *(int *)&(((LOs *)&(local_670.write_.shared_alloc_.alloc)->use_count)->write_).
                      shared_alloc_.alloc + 1;
      }
    }
    local_1b8.write_.shared_alloc_.direct_ptr = local_670.write_.shared_alloc_.direct_ptr;
    graph_reduce<double>((Omega_h *)&local_638,&local_1a8,&local_1b8,1,OMEGA_H_SUM);
    pAVar29 = local_1b8.write_.shared_alloc_.alloc;
    if (((ulong)local_1b8.write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_1b8.write_.shared_alloc_.alloc != (element_type *)0x0) {
      pLVar3 = (LOs *)&(local_1b8.write_.shared_alloc_.alloc)->use_count;
      *(int *)&(pLVar3->write_).shared_alloc_.alloc =
           *(int *)&(pLVar3->write_).shared_alloc_.alloc + -1;
      if (*(int *)&(pLVar3->write_).shared_alloc_.alloc == 0) {
        Alloc::~Alloc(local_1b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_1a8.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_1a8.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_1a8.ab2b.write_.shared_alloc_.alloc != (Library *)0x0) {
      pCVar2 = (CommPtr *)&(local_1a8.ab2b.write_.shared_alloc_.alloc)->use_count;
      *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
           -1;
      if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          0) {
        Alloc::~Alloc(local_1a8.ab2b.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_1a8.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_1a8.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_1a8.a2ab.write_.shared_alloc_.alloc != (Library *)0x0) {
      pCVar2 = (CommPtr *)&(local_1a8.a2ab.write_.shared_alloc_.alloc)->use_count;
      *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           *(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
           -1;
      if (*(int *)&(pCVar2->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          0) {
        Alloc::~Alloc(local_1a8.a2ab.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    local_1c8.write_.shared_alloc_.alloc = (Alloc *)local_638;
    if (((ulong)local_638 & 7) == 0 && local_638 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1c8.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_638->parent_comm_).
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr *
                       8 + 1);
      }
      else {
        *(int *)&local_638->items2content_[0].write_.shared_alloc_.alloc =
             *(int *)&local_638->items2content_[0].write_.shared_alloc_.alloc + 1;
      }
    }
    local_1c8.write_.shared_alloc_.direct_ptr = local_630;
    divide_each_by<double>((Omega_h *)local_628,&local_1c8,(double)((int)local_658 + 1));
    if (((ulong)local_638 & 7) == 0 && local_638 != (element_type *)0x0) {
      pLVar3 = local_638->items2content_;
      *(int *)&(pLVar3->write_).shared_alloc_.alloc =
           *(int *)&(pLVar3->write_).shared_alloc_.alloc + -1;
      if (*(int *)&(pLVar3->write_).shared_alloc_.alloc == 0) {
        Alloc::~Alloc((Alloc *)local_638);
        operator_delete(local_638,0x48);
      }
    }
    local_638 = (element_type *)local_628._0_8_;
    local_630 = (element_type *)local_628._8_8_;
    if (((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_628._0_8_ + 0x30) = *(int *)(local_628._0_8_ + 0x30) + -1;
      local_638 = (element_type *)(*(long *)local_628._0_8_ * 8 + 1);
    }
    pAVar29 = local_1c8.write_.shared_alloc_.alloc;
    local_628._0_8_ = (pointer)0x0;
    local_628._8_8_ = (element_type *)0x0;
    if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_1c8.write_.shared_alloc_.alloc != (element_type *)0x0) {
      pLVar3 = (LOs *)&(local_1c8.write_.shared_alloc_.alloc)->use_count;
      *(int *)&(pLVar3->write_).shared_alloc_.alloc =
           *(int *)&(pLVar3->write_).shared_alloc_.alloc + -1;
      if (*(int *)&(pLVar3->write_).shared_alloc_.alloc == 0) {
        Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    Mesh::ask_down(&local_78,local_660,(Int)local_658,0);
    local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000017;
    local_628._0_8_ = pAVar7;
    local_628._0_8_ = std::__cxx11::string::_M_create((ulong *)local_628,(ulong)&local_3f8);
    local_628._16_8_ = local_3f8._M_pi;
    ((Alloc *)local_628._0_8_)->size = 0x6d75746e656d6f6d;
    (((Alloc *)local_628._0_8_)->name)._M_dataplus._M_p = (pointer)0x7469636f6c65765f;
    *(undefined8 *)((long)&(((Alloc *)local_628._0_8_)->name)._M_dataplus._M_p + 7) =
         0x64657869665f7974;
    local_628._8_8_ = local_3f8._M_pi;
    *(undefined1 *)
     ((long)&(local_3f8._M_pi)->_vptr__Sp_counted_base + (long)&((Alloc *)local_628._0_8_)->size) =
         0;
    bVar23 = Mesh::has_tag(local_660,0,(string *)local_628);
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,(ulong)(local_628._16_8_ + 1));
    }
    if (bVar23) {
      local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000017;
      local_628._0_8_ = pAVar7;
      local_628._0_8_ = std::__cxx11::string::_M_create((ulong *)local_628,(ulong)&local_3f8);
      local_628._16_8_ = local_3f8._M_pi;
      ((Alloc *)local_628._0_8_)->size = 0x6d75746e656d6f6d;
      (((Alloc *)local_628._0_8_)->name)._M_dataplus._M_p = (pointer)0x7469636f6c65765f;
      *(undefined8 *)((long)&(((Alloc *)local_628._0_8_)->name)._M_dataplus._M_p + 7) =
           0x64657869665f7974;
      local_628._8_8_ = local_3f8._M_pi;
      *(undefined1 *)
       ((long)&(local_3f8._M_pi)->_vptr__Sp_counted_base + (long)&((Alloc *)local_628._0_8_)->size)
           = 0;
      Mesh::get_array<signed_char>((Mesh *)local_4a8,(Int)local_660,(string *)0x0);
    }
    else {
      size_in = Mesh::nverts(local_660);
      local_628._8_8_ = (element_type *)0x0;
      local_628._16_8_ = local_628._16_8_ & 0xffffffffffffff00;
      local_628._0_8_ = pAVar7;
      Read<signed_char>::Read((Read<signed_char> *)local_4a8,size_in,'\0',(string *)local_628);
    }
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,(ulong)(local_628._16_8_ + 1));
    }
    Mesh::get_array<double>((Mesh *)&local_650,(Int)local_660,local_658);
    local_4b8.write_.shared_alloc_.alloc = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_4b8.write_.shared_alloc_.alloc = (Alloc *)(local_650->size * 8 + 1);
      }
      else {
        local_650->use_count = local_650->use_count + 1;
      }
    }
    local_4b8.write_.shared_alloc_.direct_ptr = local_648;
    local_4c8.write_.shared_alloc_.alloc = (Alloc *)local_118._0_8_;
    if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_4c8.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_118._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_118._0_8_ + 0x30) = *(int *)(local_118._0_8_ + 0x30) + 1;
      }
    }
    local_4c8.write_.shared_alloc_.direct_ptr = (void *)local_118._8_8_;
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    add_each<double>((Omega_h *)&local_3f8,&local_4b8,&local_4c8,(string *)local_628);
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      piVar5 = &local_650->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_650);
        operator_delete(local_650,0x48);
      }
    }
    local_650 = (Alloc *)local_3f8._M_pi;
    local_648 = (element_type *)_Stack_3f0._M_pi;
    if ((((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_650 = (Alloc *)((long)(local_3f8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
    }
    local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,(ulong)(local_628._16_8_ + 1));
    }
    pAVar29 = local_4c8.write_.shared_alloc_.alloc;
    if (((ulong)local_4c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_4c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_4c8.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_4c8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    pAVar29 = local_4b8.write_.shared_alloc_.alloc;
    if (((ulong)local_4b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_4b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_4b8.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_4b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    cVar28 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
             ::find(&(xfer_opts->integral_diffuse_map)._M_t,(key_type *)local_328);
    this = local_660;
    local_38 = (element_type *)cVar28._M_node[2]._M_left;
    p_Var4 = cVar28._M_node + 2;
    local_48 = *(element_type **)p_Var4;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar28._M_node[2]._M_parent;
    opts.type = p_Var4->_M_color;
    opts._4_4_ = *(undefined4 *)&p_Var4->field_0x4;
    opts.tolerance = (Real)p_Var4->_M_parent;
    opts.floor = (Real)p_Var4->_M_left;
    local_1f8.field_2._M_allocated_capacity =
         (size_type)(diffusion_graph->a2ab).write_.shared_alloc_.alloc;
    if ((local_1f8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1f8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f8.field_2._M_allocated_capacity =
             ((Alloc *)local_1f8.field_2._M_allocated_capacity)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_1f8.field_2._M_allocated_capacity)->use_count =
             ((Alloc *)local_1f8.field_2._M_allocated_capacity)->use_count + 1;
      }
    }
    local_1f8.field_2._8_8_ = (diffusion_graph->a2ab).write_.shared_alloc_.direct_ptr;
    local_1d8 = (element_type *)(diffusion_graph->ab2b).write_.shared_alloc_.alloc;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_1d8 = (element_type *)
                    ((long)(local_1d8->parent_comm_).
                           super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8
                    + 1);
      }
      else {
        *(int *)&local_1d8->items2content_[0].write_.shared_alloc_.alloc =
             *(int *)&local_1d8->items2content_[0].write_.shared_alloc_.alloc + 1;
      }
    }
    local_1d0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (diffusion_graph->ab2b).write_.shared_alloc_.direct_ptr;
    local_4d8.write_.shared_alloc_.alloc = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_4d8.write_.shared_alloc_.alloc = (Alloc *)(local_650->size * 8 + 1);
      }
      else {
        local_650->use_count = local_650->use_count + 1;
      }
    }
    local_4d8.write_.shared_alloc_.direct_ptr = local_648;
    local_1f8._M_dataplus._M_p = (pointer)local_478.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_478.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_478.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_1f8._M_dataplus._M_p =
             (pointer)((local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_1f8._M_string_length =
         (size_type)local_478.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    diffuse_integrals_weighted
              ((Mesh *)local_628,(Graph *)local_660,(Reals *)&local_1f8.field_2,&local_4d8,opts,
               &local_1f8,SUB81(&local_578,0));
    pAVar29 = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      piVar5 = &local_650->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_650);
        operator_delete(pAVar29,0x48);
      }
    }
    local_650 = (Alloc *)local_628._0_8_;
    local_648 = (element_type *)local_628._8_8_;
    if (((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)(local_628._0_8_ + 0x30) = *(int *)(local_628._0_8_ + 0x30) + -1;
      local_650 = (Alloc *)(*(long *)local_628._0_8_ * 8 + 1);
    }
    _Var22._M_p = local_1f8._M_dataplus._M_p;
    local_628._0_8_ = (pointer)0x0;
    local_628._8_8_ = (element_type *)0x0;
    if (((ulong)local_1f8._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_1f8._M_dataplus._M_p != (Alloc *)0x0) {
      piVar5 = (int *)(local_1f8._M_dataplus._M_p + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8._M_dataplus._M_p);
        operator_delete(_Var22._M_p,0x48);
      }
    }
    pAVar29 = local_4d8.write_.shared_alloc_.alloc;
    if (((ulong)local_4d8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_4d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_4d8.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_4d8.write_.shared_alloc_.alloc);
        operator_delete(pAVar29,0x48);
      }
    }
    peVar13 = local_1d8;
    if (((ulong)local_1d8 & 7) == 0 && local_1d8 != (element_type *)0x0) {
      pLVar3 = local_1d8->items2content_;
      *(int *)&(pLVar3->write_).shared_alloc_.alloc =
           *(int *)&(pLVar3->write_).shared_alloc_.alloc + -1;
      if (*(int *)&(pLVar3->write_).shared_alloc_.alloc == 0) {
        Alloc::~Alloc((Alloc *)local_1d8);
        operator_delete(peVar13,0x48);
      }
    }
    uVar14 = local_1f8.field_2._M_allocated_capacity;
    if ((local_1f8.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_1f8.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar5 = (int *)(local_1f8.field_2._M_allocated_capacity + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_1f8.field_2._M_allocated_capacity);
        operator_delete((void *)uVar14,0x48);
      }
    }
    local_208.write_.shared_alloc_.alloc = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_208.write_.shared_alloc_.alloc = (Alloc *)(local_650->size * 8 + 1);
      }
      else {
        local_650->use_count = local_650->use_count + 1;
      }
    }
    local_208.write_.shared_alloc_.direct_ptr = local_648;
    Mesh::set_tag<double>(this,(Int)local_658,&local_578,&local_208,false);
    pAVar29 = local_208.write_.shared_alloc_.alloc;
    if (((ulong)local_208.write_.shared_alloc_.alloc & 7) == 0 &&
        local_208.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_208.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(pAVar29);
        operator_delete(pAVar29,0x48);
      }
    }
    local_4e8.write_.shared_alloc_.alloc = (Alloc *)local_548._M_pi;
    if (((ulong)local_548._M_pi & 7) == 0 && (Alloc *)local_548._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_4e8.write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_548._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_548._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_548._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_4e8.write_.shared_alloc_.direct_ptr = local_540._M_pi;
    local_628._0_8_ = pAVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"");
    deep_copy<double>((Omega_h *)&local_558,&local_4e8,(string *)local_628);
    if ((Alloc *)local_628._0_8_ != pAVar7) {
      operator_delete((void *)local_628._0_8_,(ulong)(local_628._16_8_ + 1));
    }
    pAVar7 = local_4e8.write_.shared_alloc_.alloc;
    if (((ulong)local_4e8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_4e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_4e8.write_.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_4e8.write_.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
      }
    }
    local_2e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._0_8_;
    if ((local_4a8._0_8_ & 7) == 0 && (Alloc *)local_4a8._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2e8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(size_t *)local_4a8._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_4a8._0_8_ + 0x30) = *(int *)(local_4a8._0_8_ + 0x30) + 1;
      }
    }
    local_2e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_4a8._8_8_;
    local_2d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_638;
    if (((ulong)local_638 & 7) == 0 && local_638 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_2d8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)*(Library **)&local_638->parent_comm_ * 8 + 1);
      }
      else {
        ppvVar6 = &(((HostRead<int> *)((long)local_638 + 0x28))->read_).write_.shared_alloc_.
                   direct_ptr;
        *(int *)ppvVar6 = *(int *)ppvVar6 + 1;
      }
    }
    local_2d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_630;
    local_2c8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2c8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(local_148.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_148.super_Graph.a2ab.write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + 1;
      }
    }
    local_2c0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_2b8._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc != (Library *)0x0) {
      if (entering_parallel == '\x01') {
        local_2b8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)local_148.super_Graph.ab2b.write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((CommPtr *)&(local_148.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count)->
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((CommPtr *)
                       &(local_148.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count)->
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_2b0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_2a8 = local_148.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_148.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_148.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2a8 = (Alloc *)((long)(((Graph *)&(local_148.codes.write_.shared_alloc_.alloc)->size)
                                    ->a2ab).write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        (local_148.codes.write_.shared_alloc_.alloc)->use_count =
             (local_148.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_2a0._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_148.codes.write_.shared_alloc_.direct_ptr;
    local_298 = (int)local_658;
    local_290._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_78.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_78.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_290._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(((Graph *)&(local_78.super_Graph.a2ab.write_.shared_alloc_.alloc)->size)->a2ab)
                    .write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        (local_78.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_78.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_288 = (element_type *)local_78.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_280._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_78.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_78.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_280._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(((Graph *)&(local_78.super_Graph.ab2b.write_.shared_alloc_.alloc)->size)->a2ab)
                    .write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        (local_78.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_78.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_278 = (element_type *)local_78.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_270._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_78.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        (Library *)local_78.codes.write_.shared_alloc_.alloc != (Library *)0x0) {
      if (entering_parallel == '\x01') {
        local_270._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (*(long *)local_78.codes.write_.shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((CommPtr *)&(local_78.codes.write_.shared_alloc_.alloc)->use_count)->
                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((CommPtr *)&(local_78.codes.write_.shared_alloc_.alloc)->use_count)->
                      super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    local_268 = (element_type *)local_78.codes.write_.shared_alloc_.direct_ptr;
    local_260 = local_640;
    local_258 = (element_type *)local_558._M_pi;
    if (((ulong)local_558._M_pi & 7) == 0 && (element_type *)local_558._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_258 = (element_type *)((long)(local_558._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_558._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_558._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_250._M_pi = local_550._M_pi;
    local_248 = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_248 = (Alloc *)(local_650->size * 8 + 1);
      }
      else {
        local_650->use_count = local_650->use_count + 1;
      }
    }
    local_240._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_648;
    local_63c = Mesh::nverts(this);
    _Var15._M_pi = local_2e0._M_pi;
    local_3f8._M_pi = local_2e8._M_pi;
    if (((ulong)local_2e8._M_pi & 7) == 0 && (Alloc *)local_2e8._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_3f8._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(local_2e8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_2e8._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_2e8._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    _Stack_3f0._M_pi = local_2e0._M_pi;
    local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_2d8._M_pi;
    if (((ulong)local_2d8._M_pi & 7) == 0 && (element_type *)local_2d8._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)((long)(local_2d8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_2d8._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_2d8._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    _Var20._M_pi = local_250._M_pi;
    uVar19 = local_260;
    peVar18 = local_268;
    peVar17 = local_278;
    peVar13 = local_288;
    iVar32 = local_298;
    _Var16._M_pi = local_2a0._M_pi;
    local_500._M_pi = local_2d0._M_pi;
    local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = local_2d0._M_pi;
    local_3e8.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)local_2c8._M_pi;
    if (((ulong)local_2c8._M_pi & 7) == 0 && (Alloc *)local_2c8._M_pi != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_3e8.roots2items_[0].write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_2c8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_2c8._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_2c8._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_4f8._M_pi = local_2c0._M_pi;
    local_3e8.roots2items_[0].write_.shared_alloc_.direct_ptr = local_2c0._M_pi;
    local_3e8.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)local_2b8._M_pi;
    if (((ulong)local_2b8._M_pi & 7) == 0 && (Library *)local_2b8._M_pi != (Library *)0x0) {
      if (entering_parallel == '\x01') {
        local_3e8.roots2items_[1].write_.shared_alloc_.alloc =
             (Alloc *)((long)(local_2b8._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_2b8._M_pi[3]._vptr__Sp_counted_base)->_M_ptr =
             *(int *)&((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
                      &local_2b8._M_pi[3]._vptr__Sp_counted_base)->_M_ptr + 1;
      }
    }
    local_4f0._M_pi = local_2b0._M_pi;
    local_3e8.roots2items_[1].write_.shared_alloc_.direct_ptr = local_2b0._M_pi;
    local_3e8.items2content_[0].write_.shared_alloc_.alloc = local_2a8;
    if (((ulong)local_2a8 & 7) == 0 && local_2a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_3e8.items2content_[0].write_.shared_alloc_.alloc =
             (Alloc *)((long)(((Graph *)&local_2a8->size)->a2ab).write_.shared_alloc_.alloc * 8 + 1)
        ;
      }
      else {
        local_2a8->use_count = local_2a8->use_count + 1;
      }
    }
    local_3e8.items2content_[0].write_.shared_alloc_.direct_ptr = local_2a0._M_pi;
    local_3e8.items2content_[1].write_.shared_alloc_.alloc._0_4_ = local_298;
    local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr = local_290._M_pi;
    if (((ulong)local_290._M_pi & 7) == 0 && (element_type *)local_290._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr =
             (void *)((long)(((Graph *)&(local_290._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                            shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((element_type *)(local_290._M_pi + 3))->super_Graph).a2ab.write_.shared_alloc_.
                 alloc =
             *(int *)&(((element_type *)(local_290._M_pi + 3))->super_Graph).a2ab.write_.
                      shared_alloc_.alloc + 1;
      }
    }
    local_3e8.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)local_288;
    local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr = local_280._M_pi;
    if (((ulong)local_280._M_pi & 7) == 0 && (element_type *)local_280._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr =
             (void *)((long)(((Graph *)&(local_280._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                            shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((element_type *)(local_280._M_pi + 3))->super_Graph).a2ab.write_.shared_alloc_.
                 alloc =
             *(int *)&(((element_type *)(local_280._M_pi + 3))->super_Graph).a2ab.write_.
                      shared_alloc_.alloc + 1;
      }
    }
    local_3e8.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)local_278;
    local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr = local_270._M_pi;
    if (((ulong)local_270._M_pi & 7) == 0 && (element_type *)local_270._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr =
             (void *)((long)(((Graph *)&(local_270._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                            shared_alloc_.alloc * 8 + 1);
      }
      else {
        *(int *)&(((element_type *)(local_270._M_pi + 3))->super_Graph).a2ab.write_.shared_alloc_.
                 alloc =
             *(int *)&(((element_type *)(local_270._M_pi + 3))->super_Graph).a2ab.write_.
                      shared_alloc_.alloc + 1;
      }
    }
    local_3e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_268;
    local_3e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._0_4_ = local_260;
    local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_258;
    if (((ulong)local_258 & 7) == 0 && local_258 != (element_type *)0x0) {
      if (entering_parallel == '\x01') {
        local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)((long)local_258->library_ * 8 + 1);
      }
      else {
        ppvVar6 = &(local_258->host_srcs_).read_.write_.shared_alloc_.direct_ptr;
        *(int *)ppvVar6 = *(int *)ppvVar6 + 1;
      }
    }
    local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_250._M_pi;
    local_358._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_248;
    if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_358._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_248->size * 8 + 1);
      }
      else {
        local_248->use_count = local_248->use_count + 1;
      }
    }
    _Var21._M_pi = local_240._M_pi;
    _Stack_350._M_pi = local_240._M_pi;
    if (0 < local_63c) {
      local_628._0_8_ = local_3f8._M_pi;
      local_628._8_8_ = _Var15._M_pi;
      if (((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) {
        *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base + -1;
        local_628._0_8_ = (long)(local_3f8._M_pi)->_vptr__Sp_counted_base * 8 + 1;
      }
      local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_628._16_8_ =
           local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_628._24_8_ = local_500._M_pi;
      if (((ulong)local_3e8.parent_comm_.
                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0 &&
          local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr != (element_type *)0x0) {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_3e8.parent_comm_.
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x30)
                 )->_vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_3e8.parent_comm_.
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x30))->_vptr__Sp_counted_base + -1;
        local_628._16_8_ =
             (Alloc *)((long)(local_3e8.parent_comm_.
                              super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                             ->library_ * 8 + 1);
      }
      local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_3e8.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_608 = local_3e8.roots2items_[0].write_.shared_alloc_.alloc;
      local_600 = local_4f8._M_pi;
      if (((ulong)local_3e8.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
          local_3e8.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_3e8.roots2items_[0].write_.shared_alloc_.alloc + 0x30))->
                 _vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_3e8.roots2items_[0].write_.shared_alloc_.alloc + 0x30))->
                      _vptr__Sp_counted_base + -1;
        local_608 = (Alloc *)((long)(local_3e8.roots2items_[0].write_.shared_alloc_.alloc)->size * 8
                             + 1);
      }
      local_3e8.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_3e8.roots2items_[0].write_.shared_alloc_.direct_ptr =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5f8 = (Library *)local_3e8.roots2items_[1].write_.shared_alloc_.alloc;
      local_5f0 = (element_type *)local_4f0._M_pi;
      if (((ulong)local_3e8.roots2items_[1].write_.shared_alloc_.alloc & 7) == 0 &&
          (Library *)local_3e8.roots2items_[1].write_.shared_alloc_.alloc != (Library *)0x0) {
        *(int *)&((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_3e8.roots2items_[1].write_.shared_alloc_.alloc + 0x30))->
                  _vptr__Sp_counted_base)->_M_ptr =
             *(int *)&((__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> *)
                      &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_3e8.roots2items_[1].write_.shared_alloc_.alloc + 0x30))->
                       _vptr__Sp_counted_base)->_M_ptr + -1;
        local_5f8 = (Library *)
                    ((long)(local_3e8.roots2items_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_3e8.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_3e8.roots2items_[1].write_.shared_alloc_.direct_ptr =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5e8 = local_3e8.items2content_[0].write_.shared_alloc_.alloc;
      local_5e0 = _Var16._M_pi;
      if (((ulong)local_3e8.items2content_[0].write_.shared_alloc_.alloc & 7) == 0 &&
          local_3e8.items2content_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
        *(int *)&(((element_type *)
                  ((long)local_3e8.items2content_[0].write_.shared_alloc_.alloc + 0x30))->
                 super_Graph).a2ab.write_.shared_alloc_.alloc =
             *(int *)&(((element_type *)
                       ((long)local_3e8.items2content_[0].write_.shared_alloc_.alloc + 0x30))->
                      super_Graph).a2ab.write_.shared_alloc_.alloc + -1;
        local_5e8 = (Alloc *)((long)(((Graph *)
                                     &(local_3e8.items2content_[0].write_.shared_alloc_.alloc)->size
                                     )->a2ab).write_.shared_alloc_.alloc * 8 + 1);
      }
      local_3e8.items2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_3e8.items2content_[0].write_.shared_alloc_.direct_ptr =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5d8 = iVar32;
      local_5d0 = (element_type *)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr;
      local_5c8 = peVar13;
      if (((ulong)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr & 7) == 0 &&
          (element_type *)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr !=
          (element_type *)0x0) {
        *(int *)&(((element_type *)
                  ((long)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr + 0x30))->
                 super_Graph).a2ab.write_.shared_alloc_.alloc =
             *(int *)&(((element_type *)
                       ((long)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr + 0x30))->
                      super_Graph).a2ab.write_.shared_alloc_.alloc + -1;
        local_5d0 = (element_type *)
                    ((long)(((Graph *)local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr)->
                           a2ab).write_.shared_alloc_.alloc * 8 + 1);
      }
      local_3e8.items2content_[1].write_.shared_alloc_.direct_ptr = (element_type *)0x0;
      local_3e8.msgs2content_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_5c0 = (element_type *)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr;
      local_5b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar17;
      if (((ulong)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr & 7) == 0 &&
          (element_type *)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr !=
          (element_type *)0x0) {
        *(int *)&(((element_type *)
                  ((long)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr + 0x30))->
                 super_Graph).a2ab.write_.shared_alloc_.alloc =
             *(int *)&(((element_type *)
                       ((long)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr + 0x30))->
                      super_Graph).a2ab.write_.shared_alloc_.alloc + -1;
        local_5c0 = (element_type *)
                    ((long)(((Graph *)local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr)->
                           a2ab).write_.shared_alloc_.alloc * 8 + 1);
      }
      local_3e8.msgs2content_[0].write_.shared_alloc_.direct_ptr = (element_type *)0x0;
      local_3e8.msgs2content_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_5b0 = (element_type *)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr;
      local_5a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18;
      if (((ulong)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr & 7) == 0 &&
          (element_type *)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr !=
          (element_type *)0x0) {
        *(int *)&(((element_type *)
                  ((long)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr + 0x30))->
                 super_Graph).a2ab.write_.shared_alloc_.alloc =
             *(int *)&(((element_type *)
                       ((long)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr + 0x30))->
                      super_Graph).a2ab.write_.shared_alloc_.alloc + -1;
        local_5b0 = (element_type *)
                    ((long)(((Graph *)local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr)->
                           a2ab).write_.shared_alloc_.alloc * 8 + 1);
      }
      local_3e8.msgs2content_[1].write_.shared_alloc_.direct_ptr = (element_type *)0x0;
      local_3e8.comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5a0 = uVar19;
      local_598._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_590._M_pi = _Var20._M_pi;
      if (((ulong)local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr & 7) == 0 &&
          local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_3e8.comm_[1].
                        super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x30)
                 )->_vptr__Sp_counted_base =
             *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)local_3e8.comm_[1].
                             super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                      0x30))->_vptr__Sp_counted_base + -1;
        local_598._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(local_3e8.comm_[1].
                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->library_
              * 8 + 1);
      }
      local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_3e8.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_588._M_pi = local_358._M_pi;
      local_580._M_pi = _Var21._M_pi;
      if (((ulong)local_358._M_pi & 7) == 0 && (Alloc *)local_358._M_pi != (Alloc *)0x0) {
        *(int *)&local_358._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_358._M_pi[3]._vptr__Sp_counted_base + -1;
        local_588._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(local_358._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      local_358._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_350._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      entering_parallel = '\0';
      iVar32 = iVar32 + 1;
      lVar33 = 0;
      lVar34 = 0;
      do {
        iVar10 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   *)&(local_4f8._M_pi)->_vptr__Sp_counted_base)->_M_ptr +
                         lVar34 * 4);
        lVar35 = (long)iVar10;
        iVar11 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                   *)&(local_4f8._M_pi)->_vptr__Sp_counted_base)->_M_ptr +
                         lVar34 * 4 + 4);
        if (iVar10 < iVar11) {
          pAVar7 = (&(((Graph *)&(local_500._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                     shared_alloc_.alloc)[lVar34];
          cVar8 = *(char *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base + lVar34);
          do {
            iVar10 = *(int *)((long)&(((Graph *)&(local_4f0._M_pi)->_vptr__Sp_counted_base)->a2ab).
                                     write_.shared_alloc_.alloc + lVar35 * 4);
            local_98 = (element_type *)0x0;
            _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_88 = (element_type *)0x0;
            iVar24 = iVar10 * iVar32;
            if (iVar24 < (iVar10 + 1) * iVar32) {
              lVar30 = (long)iVar24;
              do {
                if (0 < (int)local_5a0) {
                  cVar9 = *(char *)((long)&(_Var15._M_pi)->_vptr__Sp_counted_base +
                                   (long)*(int *)((long)&(((CommPtr *)
                                                          &(local_5b8._M_pi)->_vptr__Sp_counted_base
                                                          )->
                                                  super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + lVar30 * 4));
                  uVar31 = 0;
                  do {
                    if (((uint)(int)cVar9 >> ((uint)uVar31 & 0x1f) & 1) == 0) {
                      (&local_98)[uVar31] = (element_type *)((double)(&local_98)[uVar31] + 1.0);
                    }
                    uVar31 = uVar31 + 1;
                  } while (local_5a0 != uVar31);
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 != iVar24 + iVar32);
            }
            if (0 < (int)local_5a0) {
              uVar31 = 0;
              do {
                if (((uint)(int)cVar8 >> ((uint)uVar31 & 0x1f) & 1) == 0) {
                  *(double *)
                   ((long)&(((Graph *)&(local_590._M_pi)->_vptr__Sp_counted_base)->a2ab).write_.
                           shared_alloc_.alloc + uVar31 * 8 + (int)local_5a0 * lVar33) =
                       *(double *)
                        ((long)&(((Graph *)&(local_590._M_pi)->_vptr__Sp_counted_base)->a2ab).write_
                                .shared_alloc_.alloc + uVar31 * 8 + (int)local_5a0 * lVar33) -
                       (double)(&(local_580._M_pi)->_vptr__Sp_counted_base)
                               [(long)(int)(iVar10 * local_5a0) + uVar31] /
                       ((double)(&local_98)[uVar31] * (double)pAVar7);
                }
                uVar31 = uVar31 + 1;
              } while (local_5a0 != uVar31);
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != iVar11);
        }
        lVar34 = lVar34 + 1;
        lVar33 = lVar33 + 8;
      } while (local_63c != (int)lVar34);
      correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
      ::$_0::~__0((__0 *)local_628);
      this = local_660;
    }
    correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
    ::$_0::~__0((__0 *)&local_3f8);
    local_218.shared_alloc_.alloc = (Alloc *)local_558._M_pi;
    if (((ulong)local_558._M_pi & 7) == 0 && (element_type *)local_558._M_pi != (element_type *)0x0)
    {
      if (entering_parallel == '\x01') {
        local_218.shared_alloc_.alloc =
             (Alloc *)((long)(local_558._M_pi)->_vptr__Sp_counted_base * 8 + 1);
      }
      else {
        *(int *)&local_558._M_pi[3]._vptr__Sp_counted_base =
             *(int *)&local_558._M_pi[3]._vptr__Sp_counted_base + 1;
      }
    }
    local_218.shared_alloc_.direct_ptr = local_550._M_pi;
    Read<double>::Read((Read<signed_char> *)local_628,&local_218);
    pAVar7 = local_218.shared_alloc_.alloc;
    if (((ulong)local_218.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_218.shared_alloc_.alloc != (element_type *)0x0) {
      ppvVar6 = &(((HostRead<int> *)&(local_218.shared_alloc_.alloc)->ptr)->read_).write_.
                 shared_alloc_.direct_ptr;
      *(int *)ppvVar6 = *(int *)ppvVar6 + -1;
      if (*(int *)ppvVar6 == 0) {
        Alloc::~Alloc(local_218.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
      }
    }
    local_228 = (Alloc *)local_628._0_8_;
    if ((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_228 = (Alloc *)(*(long *)local_628._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_628._0_8_ + 0x30) = *(int *)(local_628._0_8_ + 0x30) + 1;
      }
    }
    local_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_628._8_8_;
    Mesh::sync_array<double>((Mesh *)&local_3f8,(Int)this,(Read<double> *)0x0,(Int)&local_228);
    uVar14 = local_628._0_8_;
    if ((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_628._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_628._0_8_);
        operator_delete((void *)uVar14,0x48);
      }
    }
    pAVar7 = local_228;
    local_628._0_8_ = local_3f8._M_pi;
    local_628._8_8_ = _Stack_3f0._M_pi;
    if ((((ulong)local_3f8._M_pi & 7) == 0 && (Alloc *)local_3f8._M_pi != (Alloc *)0x0) &&
       (entering_parallel == '\x01')) {
      *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&local_3f8._M_pi[3]._vptr__Sp_counted_base + -1;
      local_628._0_8_ = (long)(local_3f8._M_pi)->_vptr__Sp_counted_base * 8 + 1;
    }
    local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_3f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
      piVar5 = &local_228->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(pAVar7);
        operator_delete(pAVar7,0x48);
      }
    }
    local_238.write_.shared_alloc_.alloc = (Alloc *)local_628._0_8_;
    if ((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_238.write_.shared_alloc_.alloc = (Alloc *)(*(long *)local_628._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_628._0_8_ + 0x30) = *(int *)(local_628._0_8_ + 0x30) + 1;
      }
    }
    local_238.write_.shared_alloc_.direct_ptr = (void *)local_628._8_8_;
    Mesh::set_tag<double>(this,0,&local_308,&local_238,false);
    pAVar7 = local_238.write_.shared_alloc_.alloc;
    if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
        local_238.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_238.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_238.write_.shared_alloc_.alloc);
        operator_delete(pAVar7,0x48);
      }
    }
    Mesh::remove_tag(this,(Int)local_658,&local_578);
    uVar14 = local_628._0_8_;
    if ((local_628._0_8_ & 7) == 0 && (Alloc *)local_628._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_628._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_628._0_8_);
        operator_delete((void *)uVar14,0x48);
      }
    }
    correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
    ::$_0::~__0((__0 *)&local_2e8);
    if (((ulong)local_558._M_pi & 7) == 0 && (element_type *)local_558._M_pi != (element_type *)0x0)
    {
      p_Var1 = local_558._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_558._M_pi);
        operator_delete(local_558._M_pi,0x48);
      }
    }
    pAVar7 = local_650;
    if (((ulong)local_650 & 7) == 0 && local_650 != (Alloc *)0x0) {
      piVar5 = &local_650->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_650);
        operator_delete(pAVar7,0x48);
      }
    }
    if ((local_4a8._0_8_ & 7) == 0 && (Alloc *)local_4a8._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_4a8._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_4a8._0_8_);
        operator_delete((void *)local_4a8._0_8_,0x48);
      }
    }
    Adj::~Adj(&local_78);
    peVar13 = local_638;
    if (((ulong)local_638 & 7) == 0 && local_638 != (element_type *)0x0) {
      ppvVar6 = &(((HostRead<int> *)((long)local_638 + 0x28))->read_).write_.shared_alloc_.
                 direct_ptr;
      *(int *)ppvVar6 = *(int *)ppvVar6 + -1;
      if (*(int *)ppvVar6 == 0) {
        Alloc::~Alloc((Alloc *)local_638);
        operator_delete(peVar13,0x48);
      }
    }
    Adj::~Adj(&local_148);
    if ((local_118._0_8_ & 7) == 0 && (Alloc *)local_118._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_118._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_118._0_8_);
        operator_delete((void *)local_118._0_8_,0x48);
      }
    }
    if (((ulong)local_478.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_478.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_478.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_478.super_Graph.a2ab.write_.shared_alloc_.alloc);
        operator_delete(local_478.super_Graph.a2ab.write_.shared_alloc_.alloc,0x48);
      }
    }
    if ((local_e8._0_8_ & 7) == 0 && (Alloc *)local_e8._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_e8._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_e8._0_8_);
        operator_delete((void *)local_e8._0_8_,0x48);
      }
    }
    if (((ulong)local_448.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_448.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar5 = &(local_448.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_448.super_Graph.a2ab.write_.shared_alloc_.alloc);
        operator_delete(local_448.super_Graph.a2ab.write_.shared_alloc_.alloc,0x48);
      }
    }
    if ((local_b8._0_8_ & 7) == 0 && (Alloc *)local_b8._0_8_ != (Alloc *)0x0) {
      piVar5 = (int *)(local_b8._0_8_ + 0x30);
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc((Alloc *)local_b8._0_8_);
        operator_delete((void *)local_b8._0_8_,0x48);
      }
    }
    if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
      piVar5 = &local_168->use_count;
      *piVar5 = *piVar5 + -1;
      if (*piVar5 == 0) {
        Alloc::~Alloc(local_168);
        operator_delete(local_168,0x48);
      }
    }
    if (((ulong)local_548._M_pi & 7) == 0 && (Alloc *)local_548._M_pi != (Alloc *)0x0) {
      p_Var1 = local_548._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_548._M_pi);
        operator_delete(local_548._M_pi,0x48);
      }
    }
    if (((ulong)local_670.write_.shared_alloc_.alloc & 7) == 0 &&
        (element_type *)local_670.write_.shared_alloc_.alloc != (element_type *)0x0) {
      pLVar3 = (LOs *)&(local_670.write_.shared_alloc_.alloc)->use_count;
      *(int *)&(pLVar3->write_).shared_alloc_.alloc =
           *(int *)&(pLVar3->write_).shared_alloc_.alloc + -1;
      if (*(int *)&(pLVar3->write_).shared_alloc_.alloc == 0) {
        Alloc::~Alloc(local_670.write_.shared_alloc_.alloc);
        operator_delete(local_670.write_.shared_alloc_.alloc,0x48);
      }
    }
    if (((ulong)local_538._M_pi & 7) == 0 && (Alloc *)local_538._M_pi != (Alloc *)0x0) {
      p_Var1 = local_538._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_538._M_pi);
        operator_delete(local_538._M_pi,0x48);
      }
    }
    if (((ulong)local_158._M_pi & 7) == 0 && (Alloc *)local_158._M_pi != (Alloc *)0x0) {
      p_Var1 = local_158._M_pi + 3;
      *(int *)&p_Var1->_vptr__Sp_counted_base = *(int *)&p_Var1->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var1->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc((Alloc *)local_158._M_pi);
        operator_delete(local_158._M_pi,0x48);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if ((Alloc *)local_348._M_pi != (Alloc *)local_338) {
      operator_delete(local_348._M_pi,
                      (ulong)((long)&(((CommPtr *)local_338._0_8_)->
                                     super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._0_8_ != &local_318) {
      operator_delete((void *)local_328._0_8_,local_318._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void correct_momentum_error(Mesh* mesh, TransferOpts const& xfer_opts,
    Graph diffusion_graph, TagBase const* tagbase, bool verbose) {
  auto dim = mesh->dim();
  auto ncomps = tagbase->ncomps();
  auto velocity_name = tagbase->name();
  auto momentum_name =
      xfer_opts.velocity_momentum_map.find(velocity_name)->second;
  auto density_name =
      xfer_opts.velocity_density_map.find(velocity_name)->second;
  auto error_name = momentum_name + "_error";
  auto elem_densities = mesh->get_array<Real>(dim, density_name);
  auto elem_sizes = mesh->ask_sizes();
  Reals elem_masses = multiply_each(elem_densities, elem_sizes);
  auto vert_velocities = mesh->get_array<Real>(VERT, velocity_name);
  auto old_elem_densities =
      mesh->get_array<Real>(dim, std::string("old_") + density_name);
  Reals old_elem_masses = multiply_each(old_elem_densities, elem_sizes);
  auto elem_velocities = average_field(mesh, dim, ncomps, vert_velocities);
  Reals old_elem_momenta = multiply_each(elem_velocities, old_elem_masses);
  Reals new_elem_momenta = multiply_each(elem_velocities, elem_masses);
  auto elem_errors_from_density =
      subtract_each(new_elem_momenta, old_elem_momenta);
  auto verts2elems = mesh->ask_up(VERT, dim);
  auto vert_masses = graph_reduce(verts2elems, elem_masses, 1, OMEGA_H_SUM);
  vert_masses = divide_each_by(vert_masses, Real(dim + 1));
  auto elems2verts = mesh->ask_down(dim, VERT);
  auto all_flags = get_comps_are_fixed(mesh);
  auto elem_errors = mesh->get_array<Real>(dim, error_name);
  elem_errors = add_each(elem_errors, elem_errors_from_density);
  auto diffuse_tol = xfer_opts.integral_diffuse_map.find(momentum_name)->second;
  elem_errors = diffuse_integrals_weighted(mesh, diffusion_graph, elem_errors,
      new_elem_momenta, diffuse_tol, error_name, verbose);
  mesh->set_tag(dim, error_name, elem_errors);
  auto out = deep_copy(vert_velocities);
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto v_flags = all_flags[v];
    auto v_mass = vert_masses[v];
    for (auto ve = verts2elems.a2ab[v]; ve < verts2elems.a2ab[v + 1]; ++ve) {
      auto e = verts2elems.ab2b[ve];
      auto nfree_verts = zero_vector<3>();
      for (auto ev = e * (dim + 1); ev < (e + 1) * (dim + 1); ++ev) {
        auto v2 = elems2verts.ab2b[ev];
        auto v2_flags = all_flags[v2];
        for (Int comp = 0; comp < ncomps; ++comp) {
          if (!(v2_flags & (1 << comp))) nfree_verts[comp] += 1.0;
        }
      }
      for (Int comp = 0; comp < ncomps; ++comp) {
        if (!(v_flags & (1 << comp))) {
          out[v * ncomps + comp] -=
              elem_errors[e * ncomps + comp] / (nfree_verts[comp] * v_mass);
        }
      }
    }
  };
  parallel_for(mesh->nverts(), f, "correct_momentum_error");
  auto new_velocities = Reals(out);
  new_velocities = mesh->sync_array(VERT, new_velocities, ncomps);
  mesh->set_tag(VERT, velocity_name, new_velocities);
  mesh->remove_tag(dim, error_name);
}